

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# magic_enum.hpp
# Opt level: O0

int magic_enum::detail::reflected_max<number,(magic_enum::detail::enum_subtype)0,unsigned_long>
              (void)

{
  unsigned_long rhs;
  int lhs;
  
  return 300;
}

Assistant:

constexpr int reflected_max() noexcept {
  if constexpr (S == enum_subtype::flags) {
    return std::numeric_limits<U>::digits - 1;
  } else {
    constexpr auto lhs = range_max<E>::value;
    constexpr auto rhs = (std::numeric_limits<U>::max)();

    if constexpr (cmp_less(lhs, rhs)) {
      return lhs;
    } else {
      return rhs;
    }
  }
}